

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

string * __thiscall libtorrent::settings_pack::get_str_abi_cxx11_(settings_pack *this,int name)

{
  pointer ppVar1;
  int iVar2;
  __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var3;
  string *psVar4;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined8 local_2f;
  undefined4 local_27;
  undefined2 local_23;
  char local_21;
  
  if (get_str[abi:cxx11](int)::empty_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&get_str[abi:cxx11](int)::empty_abi_cxx11_);
    if (iVar2 != 0) {
      get_str[abi:cxx11](int)::empty_abi_cxx11_._M_dataplus._M_p =
           (pointer)&get_str[abi:cxx11](int)::empty_abi_cxx11_.field_2;
      get_str[abi:cxx11](int)::empty_abi_cxx11_._M_string_length = 0;
      get_str[abi:cxx11](int)::empty_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(::std::__cxx11::string::~string,&get_str[abi:cxx11](int)::empty_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&get_str[abi:cxx11](int)::empty_abi_cxx11_);
    }
  }
  if ((name & 0xc000U) == 0) {
    ppVar1 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->m_strings).
              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 == 0x208) {
      psVar4 = &ppVar1[name & 0x3fff].second;
    }
    else {
      local_40 = &local_30;
      local_60._M_p = (pointer)&local_50;
      local_50._M_local_buf[0] = '\0';
      local_50._1_8_ = local_2f;
      local_50._9_4_ = local_27;
      local_50._13_2_ = local_23;
      local_50._M_local_buf[0xf] = local_21;
      local_58 = 0;
      local_38 = 0;
      local_30 = 0;
      local_68._0_2_ = (unsigned_short)name;
      ::std::__cxx11::string::~string((string *)&local_40);
      _Var3 = ::std::
              __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>const*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>>
                        ((this->m_strings).
                         super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->m_strings).
                         super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_68,
                         (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                          )0x2bf1b1);
      if ((_Var3._M_current ==
           (this->m_strings).
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) || ((uint)(_Var3._M_current)->first != name))
      {
        psVar4 = (string *)(&DAT_004d8910 + (ulong)(name & 0x3fff) * 0x38);
      }
      else {
        psVar4 = &(_Var3._M_current)->second;
      }
      ::std::__cxx11::string::~string((string *)&local_60);
    }
  }
  else {
    psVar4 = &get_str[abi:cxx11](int)::empty_abi_cxx11_;
  }
  return psVar4;
}

Assistant:

std::string const& settings_pack::get_str(int name) const
	{
		static std::string const empty;
		TORRENT_ASSERT_PRECOND((name & type_mask) == string_type_base);
		if ((name & type_mask) != string_type_base) return empty;

		// this is an optimization. If the settings pack is complete,
		// i.e. has every key, we don't need to search, it's just a lookup
		if (m_strings.size() == settings_pack::num_string_settings)
		{
			TORRENT_ASSERT(m_strings[name & index_mask].first == name);
			return m_strings[name & index_mask].second;
		}
		std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
		auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
				, &compare_first<std::string>);
		if (i != m_strings.end() && i->first == name) return i->second;

		return str_settings[name & index_mask].default_value;
	}